

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall cs_impl::any::make<cs::pointer,cs_impl::any_const&>(any *this,any *args)

{
  holder<cs::pointer> *this_00;
  proxy *ppVar1;
  
  if ((DAT_00259010 == 0) || (cs::global_thread_counter != 0)) {
    this_00 = (holder<cs::pointer> *)operator_new(0x10);
  }
  else {
    this_00 = *(holder<cs::pointer> **)(&holder<cs::structure>::allocator + DAT_00259010 * 8);
    DAT_00259010 = DAT_00259010 + -1;
  }
  holder<cs::pointer>::holder<cs_impl::any_const&>(this_00,args);
  if ((DAT_0025b550 == 0) || (cs::global_thread_counter != 0)) {
    ppVar1 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar1 = (proxy *)(&cs::null_pointer)[DAT_0025b550];
    DAT_0025b550 = DAT_0025b550 + -1;
  }
  ppVar1->is_rvalue = false;
  ppVar1->protect_level = 0;
  ppVar1->refcount = 1;
  ppVar1->data = &this_00->super_baseHolder;
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}